

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::setMinimumSize(QWidget *this,int minw,int minh)

{
  undefined1 *puVar1;
  uint uVar2;
  uint uVar3;
  QWidgetPrivate *this_00;
  int iVar4;
  int iVar5;
  bool bVar6;
  QWidgetData *pQVar7;
  QWExtra *pQVar8;
  Representation RVar9;
  Representation RVar10;
  uint uVar11;
  long in_FS_OFFSET;
  int local_50;
  int local_4c;
  undefined1 local_48 [8];
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  local_50 = minh;
  local_4c = minw;
  bVar6 = QWidgetPrivate::setMinimumSize_helper(this_00,&local_4c,&local_50);
  if (!bVar6) goto LAB_002ff9d1;
  pQVar7 = this->data;
  if (((pQVar7->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
    QWidgetPrivate::setConstraints_sys(this_00);
    pQVar7 = this->data;
  }
  iVar5 = local_4c;
  iVar4 = local_50;
  RVar9.m_i = ((pQVar7->crect).x2.m_i - (pQVar7->crect).x1.m_i) + 1;
  if (RVar9.m_i < local_4c) {
    RVar10.m_i = ((pQVar7->crect).y2.m_i - (pQVar7->crect).y1.m_i) + 1;
LAB_002ff90e:
    uVar11 = *(uint *)(*(long *)&this->field_0x8 + 0x240) & 0x400;
    if (RVar9.m_i < local_4c) {
      RVar9.m_i = local_4c;
    }
    if (RVar10.m_i < local_50) {
      RVar10.m_i = local_50;
    }
    uVar2 = *(uint *)&pQVar7->field_0x10;
    local_48._4_4_ = RVar10.m_i;
    local_48._0_4_ = RVar9.m_i;
    resize(this,(QSize *)local_48);
    uVar3 = *(uint *)(*(long *)&this->field_0x8 + 0x240);
    if ((byte)(uVar11 >> 10) != ((byte)(uVar3 >> 10) & 1)) {
      *(uint *)(*(long *)&this->field_0x8 + 0x240) = uVar3 & 0xfffffbff | uVar11;
    }
    if ((uVar2 & 2) != 0) {
      puVar1 = &this->data->field_0x10;
      *(uint *)puVar1 = *(uint *)puVar1 | 2;
    }
  }
  else {
    RVar10.m_i = ((pQVar7->crect).y2.m_i - (pQVar7->crect).y1.m_i) + 1;
    if (RVar10.m_i < local_50) goto LAB_002ff90e;
  }
  pQVar8 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (pQVar8->proxyWidget != (QGraphicsProxyWidget *)0x0) {
    local_48 = (undefined1  [8])(double)iVar5;
    local_40 = (double)iVar4;
    QGraphicsLayoutItem::setMinimumSize
              (&(pQVar8->proxyWidget->super_QGraphicsWidget).super_QGraphicsLayoutItem,
               (QSizeF *)local_48);
    pQVar8 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
             _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  }
  if (pQVar8->minw == pQVar8->maxw) {
    bVar6 = pQVar8->minh == pQVar8->maxh;
  }
  else {
    bVar6 = false;
  }
  QWidgetPrivate::updateGeometry_helper(this_00,bVar6);
LAB_002ff9d1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setMinimumSize(int minw, int minh)
{
    Q_D(QWidget);
    if (!d->setMinimumSize_helper(minw, minh))
        return;

    if (isWindow())
        d->setConstraints_sys();
    if (minw > width() || minh > height()) {
        bool resized = testAttribute(Qt::WA_Resized);
        bool maximized = isMaximized();
        resize(qMax(minw,width()), qMax(minh,height()));
        setAttribute(Qt::WA_Resized, resized); //not a user resize
        if (maximized)
            data->window_state = data->window_state | Qt::WindowMaximized;
    }
#if QT_CONFIG(graphicsview)
    if (d->extra) {
        if (d->extra->proxyWidget)
            d->extra->proxyWidget->setMinimumSize(minw, minh);
    }
#endif
    d->updateGeometry_helper(d->extra->minw == d->extra->maxw && d->extra->minh == d->extra->maxh);
}